

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FStateDefine *
FStateDefinitions::FindStateLabelInList
          (TArray<FStateDefine,_FStateDefine> *list,FName *name,bool create)

{
  FStateDefine *pFVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  FStateDefine *pFVar5;
  FStateDefine local_40;
  
  pFVar5 = list->Array + -1;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (list->Count == uVar4) {
      pFVar5 = (FStateDefine *)0x0;
      break;
    }
    pFVar1 = pFVar5 + 1;
    pFVar5 = pFVar5 + 1;
    uVar2 = uVar4 + 1;
  } while ((pFVar1->Label).Index != name->Index);
  if (create && list->Count <= uVar4) {
    local_40.Children.Array = (FStateDefine *)0x0;
    local_40.Children.Most = 0;
    local_40.Children.Count = 0;
    local_40.Label = (FName)name->Index;
    local_40.State = (FState *)0x0;
    local_40.DefineFlags = '\0';
    uVar3 = TArray<FStateDefine,_FStateDefine>::Push(list,&local_40);
    pFVar5 = list->Array + uVar3;
    TArray<FStateDefine,_FStateDefine>::~TArray(&local_40.Children);
  }
  return pFVar5;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateLabelInList(TArray<FStateDefine> & list, FName name, bool create)
{
	for(unsigned i = 0; i<list.Size(); i++)
	{
		if (list[i].Label == name)
		{
			return &list[i];
		}
	}
	if (create)
	{
		FStateDefine def;
		def.Label = name;
		def.State = NULL;
		def.DefineFlags = SDF_NEXT;
		return &list[list.Push(def)];
	}
	return NULL;
}